

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

void __thiscall re2::Compiler::Setup(Compiler *this,ParseFlags flags,int64 max_mem,Anchor anchor)

{
  int iVar1;
  
  this->prog_->flags_ = flags;
  if ((flags & Latin1) != NoParseFlags) {
    this->encoding_ = kEncodingLatin1;
  }
  this->max_mem_ = max_mem;
  if (max_mem < 1) {
    iVar1 = 100000;
  }
  else {
    iVar1 = 0;
    if (0x1b8 < (ulong)max_mem) {
      iVar1 = 0x1000000;
      if (max_mem - 0x1b8U < 0x8000000) {
        iVar1 = (int)(max_mem - 0x1b8U >> 3);
      }
    }
  }
  this->max_inst_ = iVar1;
  this->anchor_ = anchor;
  return;
}

Assistant:

void Compiler::Setup(Regexp::ParseFlags flags, int64 max_mem,
                     RE2::Anchor anchor) {
  prog_->set_flags(flags);

  if (flags & Regexp::Latin1)
    encoding_ = kEncodingLatin1;
  max_mem_ = max_mem;
  if (max_mem <= 0) {
    max_inst_ = 100000;  // more than enough
  } else if (max_mem <= static_cast<int64>(sizeof(Prog))) {
    // No room for anything.
    max_inst_ = 0;
  } else {
    int64 m = (max_mem - sizeof(Prog)) / sizeof(Prog::Inst);
    // Limit instruction count so that inst->id() fits nicely in an int.
    // SparseArray also assumes that the indices (inst->id()) are ints.
    // The call to WalkExponential uses 2*max_inst_ below,
    // and other places in the code use 2 or 3 * prog->size().
    // Limiting to 2^24 should avoid overflow in those places.
    // (The point of allowing more than 32 bits of memory is to
    // have plenty of room for the DFA states, not to use it up
    // on the program.)
    if (m >= 1<<24)
      m = 1<<24;

    // Inst imposes its own limit (currently bigger than 2^24 but be safe).
    if (m > Prog::Inst::kMaxInst)
      m = Prog::Inst::kMaxInst;

    max_inst_ = static_cast<int>(m);
  }

  anchor_ = anchor;
}